

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void __thiscall ObjectBlockPool<256,_256>::Mark(ObjectBlockPool<256,_256> *this,uint number)

{
  MyLargeBlock *pMVar1;
  MyLargeBlock **ppMVar2;
  Block *pBVar3;
  uint i;
  ulong uVar4;
  ulong uVar5;
  
  if (number < 2) {
    ppMVar2 = &this->activePages;
    while (pMVar1 = *ppMVar2, pMVar1 != (MyLargeBlock *)0x0) {
      pBVar3 = pMVar1->page;
      uVar4 = 0;
      while( true ) {
        uVar5 = (ulong)this->lastNum;
        if (pMVar1 != this->activePages) {
          uVar5 = 0x100;
        }
        if (uVar5 <= uVar4) break;
        pBVar3->marker = pBVar3->marker & 0xfffffffffffffffe | (ulong)number;
        uVar4 = uVar4 + 1;
        pBVar3 = pBVar3 + 1;
      }
      ppMVar2 = &pMVar1->next;
    }
    return;
  }
  __assert_fail("number <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StdLib.cpp"
                ,0xe6,
                "void ObjectBlockPool<256, 256>::Mark(unsigned int) [elemSize = 256, countInBlock = 256]"
               );
}

Assistant:

void Mark(unsigned int number)
	{
		assert(number <= 1);
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				curr->page[i].marker = (curr->page[i].marker & ~NULLC::OBJECT_VISIBLE) | number;
			}
			curr = curr->next;
		}
	}